

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpruneL.c
# Opt level: O3

void zpruneL(int jcol,int *perm_r,int pivrow,int nseg,int *segrep,int *repfnz,int_t *xprune,
            GlobalLU_t *Glu)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  int_t *piVar9;
  int_t *piVar10;
  void *pvVar11;
  int_t *piVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  doublecomplex utemp;
  
  if (nseg < 1) {
    return;
  }
  piVar7 = Glu->xsup;
  piVar8 = Glu->supno;
  piVar9 = Glu->lsub;
  piVar10 = Glu->xlsub;
  pvVar11 = Glu->lusup;
  piVar12 = Glu->xlusup;
  iVar3 = piVar8[jcol];
  uVar19 = 0;
LAB_0010a7e6:
  iVar4 = segrep[uVar19];
  if ((((repfnz[iVar4] != -1) && (iVar5 = piVar8[iVar4], iVar5 != piVar8[(long)iVar4 + 1])) &&
      (iVar5 != iVar3)) && (iVar6 = piVar10[(long)iVar4 + 1], iVar6 <= xprune[iVar4])) {
    iVar18 = piVar10[iVar4];
    if (iVar18 < iVar6) {
      iVar17 = iVar6 + -1;
      lVar20 = 0;
      do {
        if (piVar9[iVar18 + lVar20] == pivrow) {
          iVar5 = piVar7[iVar5];
          goto LAB_0010a86f;
        }
        lVar20 = lVar20 + 1;
      } while (iVar6 - iVar18 != (int)lVar20);
    }
  }
  goto LAB_0010a901;
LAB_0010a86f:
  do {
    if (perm_r[piVar9[iVar17]] == -1) {
LAB_0010a8ec:
      iVar17 = iVar17 + -1;
    }
    else {
      iVar6 = piVar9[iVar18];
      if (perm_r[iVar6] == -1) {
        piVar9[iVar18] = piVar9[iVar17];
        piVar9[iVar17] = iVar6;
        if (iVar4 == iVar5) {
          lVar16 = (long)((piVar12[iVar4] + iVar18) - piVar10[iVar4]) * 0x10;
          puVar1 = (undefined8 *)((long)pvVar11 + lVar16);
          uVar13 = *puVar1;
          uVar14 = puVar1[1];
          lVar20 = (long)((piVar12[iVar4] + iVar17) - piVar10[iVar4]) * 0x10;
          puVar1 = (undefined8 *)((long)pvVar11 + lVar20);
          uVar15 = puVar1[1];
          puVar2 = (undefined8 *)((long)pvVar11 + lVar16);
          *puVar2 = *puVar1;
          puVar2[1] = uVar15;
          puVar1 = (undefined8 *)((long)pvVar11 + lVar20);
          *puVar1 = uVar13;
          puVar1[1] = uVar14;
        }
        iVar18 = iVar18 + 1;
        goto LAB_0010a8ec;
      }
      iVar18 = iVar18 + 1;
    }
  } while (iVar18 <= iVar17);
  xprune[iVar4] = iVar18;
LAB_0010a901:
  uVar19 = uVar19 + 1;
  if (uVar19 == (uint)nseg) {
    return;
  }
  goto LAB_0010a7e6;
}

Assistant:

void
zpruneL(
       const int  jcol,	     /* in */
       const int  *perm_r,   /* in */
       const int  pivrow,    /* in */
       const int  nseg,	     /* in */
       const int  *segrep,   /* in */
       const int  *repfnz,   /* in */
       int_t      *xprune,   /* out */
       GlobalLU_t *Glu       /* modified - global LU data structures */
       )
{

    doublecomplex     utemp;
    int        jsupno, irep, irep1, kmin, kmax, krow, movnum;
    int_t      i, ktemp, minloc, maxloc;
    int        do_prune; /* logical variable */
    int        *xsup, *supno;
    int_t      *lsub, *xlsub;
    doublecomplex     *lusup;
    int_t      *xlusup;

    xsup       = Glu->xsup;
    supno      = Glu->supno;
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (doublecomplex *) Glu->lusup;
    xlusup     = Glu->xlusup;
    
    /*
     * For each supernode-rep irep in U[*,j]
     */
    jsupno = supno[jcol];
    for (i = 0; i < nseg; i++) {

	irep = segrep[i];
	irep1 = irep + 1;
	do_prune = FALSE;

	/* Don't prune with a zero U-segment */
 	if ( repfnz[irep] == SLU_EMPTY )
		continue;

     	/* If a snode overlaps with the next panel, then the U-segment 
   	 * is fragmented into two parts -- irep and irep1. We should let
	 * pruning occur at the rep-column in irep1's snode. 
	 */
	if ( supno[irep] == supno[irep1] ) 	/* Don't prune */
		continue;

	/*
	 * If it has not been pruned & it has a nonz in row L[pivrow,i]
	 */
	if ( supno[irep] != jsupno ) {
	    if ( xprune[irep] >= xlsub[irep1] ) {
		kmin = xlsub[irep];
		kmax = xlsub[irep1] - 1;
		for (krow = kmin; krow <= kmax; krow++) 
		    if ( lsub[krow] == pivrow ) {
			do_prune = TRUE;
			break;
		    }
	    }
	    
    	    if ( do_prune ) {

	     	/* Do a quicksort-type partition
	     	 * movnum=TRUE means that the num values have to be exchanged.
	     	 */
	        movnum = FALSE;
	        if ( irep == xsup[supno[irep]] ) /* Snode of size 1 */
			movnum = TRUE;

	        while ( kmin <= kmax ) {

	    	    if ( perm_r[lsub[kmax]] == SLU_EMPTY ) 
			kmax--;
		    else if ( perm_r[lsub[kmin]] != SLU_EMPTY )
			kmin++;
		    else { /* kmin below pivrow (not yet pivoted), and kmax
                            * above pivrow: interchange the two subscripts
			    */
		        ktemp = lsub[kmin];
		        lsub[kmin] = lsub[kmax];
		        lsub[kmax] = ktemp;

			/* If the supernode has only one column, then we
 			 * only keep one set of subscripts. For any subscript 
			 * interchange performed, similar interchange must be 
			 * done on the numerical values.
 			 */
		        if ( movnum ) {
		    	    minloc = xlusup[irep] + (kmin - xlsub[irep]);
		    	    maxloc = xlusup[irep] + (kmax - xlsub[irep]);
			    utemp = lusup[minloc];
		  	    lusup[minloc] = lusup[maxloc];
			    lusup[maxloc] = utemp;
		        }

		        kmin++;
		        kmax--;

		    }

	        } /* while */

	        xprune[irep] = kmin;	/* Pruning */

#ifdef CHK_PRUNE
	printf("    After zpruneL(),using col %d:  xprune[%d] = %d\n", 
			jcol, irep, kmin);
#endif
	    } /* if do_prune */

	} /* if */

    } /* for each U-segment... */
}